

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

void __thiscall
JsrtDebuggerObjectProperty::~JsrtDebuggerObjectProperty(JsrtDebuggerObjectProperty *this)

{
  JsrtDebuggerObjectProperty *this_local;
  
  (this->super_JsrtDebuggerObjectBase)._vptr_JsrtDebuggerObjectBase =
       (_func_int **)&PTR__JsrtDebuggerObjectProperty_01dd1ad0;
  if (this->objectDisplay != (WeakArenaReference<Js::IDiagObjectModelDisplay> *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>>
              (&Memory::HeapAllocator::Instance,this->objectDisplay);
    this->objectDisplay = (WeakArenaReference<Js::IDiagObjectModelDisplay> *)0x0;
  }
  if (this->walkerRef != (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>>
              (&Memory::HeapAllocator::Instance,this->walkerRef);
    this->walkerRef = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
  }
  JsrtDebuggerObjectBase::~JsrtDebuggerObjectBase(&this->super_JsrtDebuggerObjectBase);
  return;
}

Assistant:

JsrtDebuggerObjectProperty::~JsrtDebuggerObjectProperty()
{
    if (this->objectDisplay != nullptr)
    {
        HeapDelete(this->objectDisplay);
        this->objectDisplay = nullptr;
    }

    if (this->walkerRef != nullptr)
    {
        HeapDelete(this->walkerRef);
        this->walkerRef = nullptr;
    }
}